

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.h
# Opt level: O0

void __thiscall
Js::StringProfiler::ConcatMetrics::Accumulate(ConcatMetrics *this,ConcatType concatType)

{
  ConcatType concatType_local;
  ConcatMetrics *this_local;
  
  switch(concatType) {
  case ConcatType_Unknown:
    this->unknownCount = this->unknownCount + 1;
    break;
  case ConcatType_CompoundString:
    this->compoundStringCount = this->compoundStringCount + 1;
    break;
  case ConcatType_ConcatTree:
    this->concatTreeCount = this->concatTreeCount + 1;
    break;
  case ConcatType_BufferString:
    this->bufferStringBuilderCount = this->bufferStringBuilderCount + 1;
  }
  return;
}

Assistant:

void Accumulate(ConcatType concatType)
            {
                switch(concatType)
                {
                case ConcatType_CompoundString:
                    this->compoundStringCount++;
                    break;
                case ConcatType_ConcatTree:
                    this->concatTreeCount++;
                    break;
                case ConcatType_BufferString:
                    this->bufferStringBuilderCount++;
                    break;
                case ConcatType_Unknown:
                    this->unknownCount++;
                    break;
                }
            }